

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::Pooling3DLayerParams::_InternalSerialize
          (Pooling3DLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  void *data;
  uint8_t *puVar3;
  uint8_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  size_t __n;
  
  if (this->type_ != 0) {
    puVar3 = target;
    if (stream->end_ <= target) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar2 = this->type_;
    *puVar3 = '\b';
    puVar3[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      target = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar3[2] = (uint8_t)uVar6;
      target = puVar3 + 3;
      if (0x3fff < uVar2) {
        uVar7 = (ulong)puVar3[2];
        do {
          target[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *target = (uint8_t)uVar5;
          target = target + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  puVar3 = target;
  if (this->kerneldepth_ != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar2 = this->kerneldepth_;
    *target = '\x10';
    target[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      puVar3 = target + 2;
    }
    else {
      target[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      target[2] = (uint8_t)uVar6;
      puVar3 = target + 3;
      if (0x3fff < uVar2) {
        uVar7 = (ulong)target[2];
        do {
          puVar3[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar3 = (uint8_t)uVar5;
          puVar3 = puVar3 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  if (this->kernelheight_ != 0) {
    puVar4 = puVar3;
    if (stream->end_ <= puVar3) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
    }
    uVar2 = this->kernelheight_;
    *puVar4 = '\x18';
    puVar4[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      puVar3 = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar4[2] = (uint8_t)uVar6;
      puVar3 = puVar4 + 3;
      if (0x3fff < uVar2) {
        uVar7 = (ulong)puVar4[2];
        do {
          puVar3[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar3 = (uint8_t)uVar5;
          puVar3 = puVar3 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  puVar4 = puVar3;
  if (this->kernelwidth_ != 0) {
    if (stream->end_ <= puVar3) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
    }
    uVar2 = this->kernelwidth_;
    *puVar3 = ' ';
    puVar3[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      puVar4 = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar3[2] = (uint8_t)uVar6;
      puVar4 = puVar3 + 3;
      if (0x3fff < uVar2) {
        uVar7 = (ulong)puVar3[2];
        do {
          puVar4[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar4 = (uint8_t)uVar5;
          puVar4 = puVar4 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  if (this->stridedepth_ != 0) {
    puVar3 = puVar4;
    if (stream->end_ <= puVar4) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
    }
    uVar2 = this->stridedepth_;
    *puVar3 = '(';
    puVar3[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      puVar4 = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar3[2] = (uint8_t)uVar6;
      puVar4 = puVar3 + 3;
      if (0x3fff < uVar2) {
        uVar7 = (ulong)puVar3[2];
        do {
          puVar4[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar4 = (uint8_t)uVar5;
          puVar4 = puVar4 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  puVar3 = puVar4;
  if (this->strideheight_ != 0) {
    if (stream->end_ <= puVar4) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
    }
    uVar2 = this->strideheight_;
    *puVar4 = '0';
    puVar4[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      puVar3 = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar4[2] = (uint8_t)uVar6;
      puVar3 = puVar4 + 3;
      if (0x3fff < uVar2) {
        uVar7 = (ulong)puVar4[2];
        do {
          puVar3[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar3 = (uint8_t)uVar5;
          puVar3 = puVar3 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  if (this->stridewidth_ != 0) {
    puVar4 = puVar3;
    if (stream->end_ <= puVar3) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
    }
    uVar2 = this->stridewidth_;
    *puVar4 = '8';
    puVar4[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      puVar3 = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar4[2] = (uint8_t)uVar6;
      puVar3 = puVar4 + 3;
      if (0x3fff < uVar2) {
        uVar7 = (ulong)puVar4[2];
        do {
          puVar3[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar3 = (uint8_t)uVar5;
          puVar3 = puVar3 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  puVar4 = puVar3;
  if (this->custompaddingfront_ != 0) {
    if (stream->end_ <= puVar3) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
    }
    uVar2 = this->custompaddingfront_;
    *puVar3 = '@';
    puVar3[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      puVar4 = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar3[2] = (uint8_t)uVar6;
      puVar4 = puVar3 + 3;
      if (0x3fff < uVar2) {
        uVar7 = (ulong)puVar3[2];
        do {
          puVar4[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar4 = (uint8_t)uVar5;
          puVar4 = puVar4 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  if (this->custompaddingback_ != 0) {
    puVar3 = puVar4;
    if (stream->end_ <= puVar4) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
    }
    uVar2 = this->custompaddingback_;
    *puVar3 = 'H';
    puVar3[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      puVar4 = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar3[2] = (uint8_t)uVar6;
      puVar4 = puVar3 + 3;
      if (0x3fff < uVar2) {
        uVar7 = (ulong)puVar3[2];
        do {
          puVar4[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar4 = (uint8_t)uVar5;
          puVar4 = puVar4 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  puVar3 = puVar4;
  if (this->custompaddingtop_ != 0) {
    if (stream->end_ <= puVar4) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
    }
    uVar2 = this->custompaddingtop_;
    *puVar4 = 'P';
    puVar4[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      puVar3 = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar4[2] = (uint8_t)uVar6;
      puVar3 = puVar4 + 3;
      if (0x3fff < uVar2) {
        uVar7 = (ulong)puVar4[2];
        do {
          puVar3[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar3 = (uint8_t)uVar5;
          puVar3 = puVar3 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  if (this->custompaddingbottom_ != 0) {
    puVar4 = puVar3;
    if (stream->end_ <= puVar3) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
    }
    uVar2 = this->custompaddingbottom_;
    *puVar4 = 'X';
    puVar4[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      puVar3 = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar4[2] = (uint8_t)uVar6;
      puVar3 = puVar4 + 3;
      if (0x3fff < uVar2) {
        uVar7 = (ulong)puVar4[2];
        do {
          puVar3[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar3 = (uint8_t)uVar5;
          puVar3 = puVar3 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  puVar4 = puVar3;
  if (this->custompaddingleft_ != 0) {
    if (stream->end_ <= puVar3) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
    }
    uVar2 = this->custompaddingleft_;
    *puVar3 = '`';
    puVar3[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      puVar4 = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar3[2] = (uint8_t)uVar6;
      puVar4 = puVar3 + 3;
      if (0x3fff < uVar2) {
        uVar7 = (ulong)puVar3[2];
        do {
          puVar4[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar4 = (uint8_t)uVar5;
          puVar4 = puVar4 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  if (this->custompaddingright_ != 0) {
    puVar3 = puVar4;
    if (stream->end_ <= puVar4) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
    }
    uVar2 = this->custompaddingright_;
    *puVar3 = 'h';
    puVar3[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      puVar4 = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar3[2] = (uint8_t)uVar6;
      puVar4 = puVar3 + 3;
      if (0x3fff < uVar2) {
        uVar7 = (ulong)puVar3[2];
        do {
          puVar4[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar4 = (uint8_t)uVar5;
          puVar4 = puVar4 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  if (this->countexcludepadding_ == true) {
    if (stream->end_ <= puVar4) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
    }
    bVar1 = this->countexcludepadding_;
    *puVar4 = 'p';
    puVar4[1] = bVar1;
    puVar4 = puVar4 + 2;
  }
  puVar3 = puVar4;
  if (this->paddingtype_ != 0) {
    if (stream->end_ <= puVar4) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
    }
    uVar2 = this->paddingtype_;
    *puVar4 = 'x';
    puVar4[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      puVar3 = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar4[2] = (uint8_t)uVar6;
      puVar3 = puVar4 + 3;
      if (0x3fff < uVar2) {
        uVar7 = (ulong)puVar4[2];
        do {
          puVar3[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar3 = (uint8_t)uVar5;
          puVar3 = puVar3 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar1);
      }
    }
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    data = *(void **)((uVar6 & 0xfffffffffffffffc) + 8);
    uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar6 & 1) == 0) {
      puVar8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar8 = (undefined8 *)((uVar6 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar8[1];
    if ((long)stream->end_ - (long)puVar3 < (long)__n) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar8[1],puVar3);
      return puVar3;
    }
    memcpy(puVar3,data,__n);
    puVar3 = puVar3 + __n;
  }
  return puVar3;
}

Assistant:

uint8_t* Pooling3DLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.Pooling3DLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Pooling3DLayerParams.PoolingType3D type = 1;
  if (this->_internal_type() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      1, this->_internal_type(), target);
  }

  // int32 kernelDepth = 2;
  if (this->_internal_kerneldepth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(2, this->_internal_kerneldepth(), target);
  }

  // int32 kernelHeight = 3;
  if (this->_internal_kernelheight() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(3, this->_internal_kernelheight(), target);
  }

  // int32 kernelWidth = 4;
  if (this->_internal_kernelwidth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(4, this->_internal_kernelwidth(), target);
  }

  // int32 strideDepth = 5;
  if (this->_internal_stridedepth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(5, this->_internal_stridedepth(), target);
  }

  // int32 strideHeight = 6;
  if (this->_internal_strideheight() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(6, this->_internal_strideheight(), target);
  }

  // int32 strideWidth = 7;
  if (this->_internal_stridewidth() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(7, this->_internal_stridewidth(), target);
  }

  // int32 customPaddingFront = 8;
  if (this->_internal_custompaddingfront() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(8, this->_internal_custompaddingfront(), target);
  }

  // int32 customPaddingBack = 9;
  if (this->_internal_custompaddingback() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(9, this->_internal_custompaddingback(), target);
  }

  // int32 customPaddingTop = 10;
  if (this->_internal_custompaddingtop() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(10, this->_internal_custompaddingtop(), target);
  }

  // int32 customPaddingBottom = 11;
  if (this->_internal_custompaddingbottom() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(11, this->_internal_custompaddingbottom(), target);
  }

  // int32 customPaddingLeft = 12;
  if (this->_internal_custompaddingleft() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(12, this->_internal_custompaddingleft(), target);
  }

  // int32 customPaddingRight = 13;
  if (this->_internal_custompaddingright() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(13, this->_internal_custompaddingright(), target);
  }

  // bool countExcludePadding = 14;
  if (this->_internal_countexcludepadding() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(14, this->_internal_countexcludepadding(), target);
  }

  // .CoreML.Specification.Pooling3DLayerParams.Pooling3DPaddingType paddingType = 15;
  if (this->_internal_paddingtype() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      15, this->_internal_paddingtype(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.Pooling3DLayerParams)
  return target;
}